

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_check_mandatory_data
              (lyd_node *root,lyd_node *last_parent,ly_set *instances,lys_node *schema,int options)

{
  LYS_NODE LVar1;
  uint uVar2;
  int iVar3;
  lys_node *plVar4;
  lyd_node *node;
  lys_module *plVar5;
  char **ppcVar6;
  char *pcVar7;
  LY_ECODE code;
  lyd_node *node_00;
  int local_3c;
  lys_node *plStack_38;
  int state;
  
  if (instances->number == 0) {
    plStack_38 = (lys_node *)last_parent;
    plVar4 = lys_is_disabled(schema,2);
    if (((uint)options >> 0xd & 1) != 0) {
      return 0;
    }
    if (plVar4 != (lys_node *)0x0) {
      return 0;
    }
    if ((char)options != '\0') {
      if ((schema->flags & 2) != 0) {
        return 0;
      }
      last_parent = (lyd_node *)plStack_38;
      if ((options & 0x71U) == 0) goto LAB_001645e6;
    }
    if (plStack_38 == (lys_node *)0x0) {
      plVar4 = (lys_node *)0x0;
    }
    else {
      plVar4 = (lys_node *)plStack_38->name;
    }
    iVar3 = resolve_applies_when(schema,1,plVar4);
    last_parent = (lyd_node *)plStack_38;
    if (iVar3 != 0) {
      node = lyd_new_dummy(root,(lyd_node *)plStack_38,schema,(char *)0x0,0);
      if (node == (lyd_node *)0x0) {
        return 1;
      }
      if (node->parent == (lyd_node *)0x0) {
        lyd_insert_before(root,node);
      }
      node_00 = node;
      do {
        ly_vlog_hide('\x01');
        resolve_when(node_00,&local_3c,0);
        ly_vlog_hide('\0');
        if (local_3c == 0) {
          lyd_free(node);
          ly_err_clean(1);
          return 0;
        }
      } while (((node_00->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
              (node_00 = node_00->child, node_00 != (lyd_node *)0x0));
      lyd_free(node);
      last_parent = (lyd_node *)plStack_38;
    }
  }
LAB_001645e6:
  LVar1 = schema->nodetype;
  if ((int)LVar1 < 0x10) {
    if (LVar1 == LYS_LEAF) goto LAB_0016468e;
    if (LVar1 != LYS_LEAFLIST) goto LAB_0016480e;
    if ((*(uint *)&schema[1].priv != 0) && (instances->number < *(uint *)&schema[1].priv))
    goto LAB_001646ca;
    uVar2 = *(uint *)((long)&schema[1].priv + 4);
  }
  else {
    if (LVar1 != LYS_LIST) {
      if ((LVar1 != LYS_ANYDATA) && (LVar1 != LYS_ANYXML)) {
LAB_0016480e:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                      ,0xab,
                      "int lyd_check_mandatory_data(struct lyd_node *, struct lyd_node *, struct ly_set *, struct lys_node *, int)"
                     );
      }
LAB_0016468e:
      if ((schema->flags & 0x40) == 0) {
        return 0;
      }
      if (instances->number == 0) {
        pcVar7 = schema->name;
        if ((lys_node *)last_parent == (lys_node *)0x0) {
          plVar5 = lys_node_module(schema);
          ppcVar6 = &plVar5->name;
        }
        else {
          ppcVar6 = (char **)((lys_node *)last_parent)->name;
        }
        ly_vlog(LYE_MISSELEM,LY_VLOG_LYD,last_parent,pcVar7,*ppcVar6);
        return 1;
      }
      return 0;
    }
    if ((*(uint *)&schema[1].iffeature != 0) && (instances->number < *(uint *)&schema[1].iffeature))
    {
LAB_001646ca:
      pcVar7 = schema->name;
      code = LYE_NOMIN;
      goto LAB_00164700;
    }
    uVar2 = *(uint *)((long)&schema[1].iffeature + 4);
  }
  if ((ulong)uVar2 == 0) {
    return 0;
  }
  if (instances->number <= uVar2) {
    return 0;
  }
  last_parent = (lyd_node *)(instances->set).s[uVar2];
  pcVar7 = schema->name;
  code = LYE_NOMAX;
LAB_00164700:
  ly_vlog(code,LY_VLOG_LYD,last_parent,pcVar7);
  return 1;
}

Assistant:

static int
lyd_check_mandatory_data(struct lyd_node *root, struct lyd_node *last_parent,
                         struct ly_set *instances, struct lys_node *schema, int options)
{
    struct lyd_node *dummy, *current;
    int state;
    uint32_t limit;

    if (!instances->number) {
        /* no instance in the data tree - check if the instantiating is enabled
         * (check: if-feature, when, status data in non-status data tree)
         */
        if (lys_is_disabled(schema, 2)) {
            /* disabled by if-feature */
            return EXIT_SUCCESS;
        } else if ((options & LYD_OPT_TRUSTED) || ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R))) {
            /* status schema node in non-status data tree */
            return EXIT_SUCCESS;
        } else {
            if ((!(options & LYD_OPT_TYPEMASK) || (options & (LYD_OPT_CONFIG | LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)))
                    && resolve_applies_when(schema, 1, last_parent ? last_parent->schema : NULL)) {
                /* evaluate when statements */
                dummy = lyd_new_dummy(root, last_parent, schema, NULL, 0);
                if (!dummy) {
                    return EXIT_FAILURE;
                }
                if (!dummy->parent) {
                    /* connect dummy nodes into the data tree, insert it before the root
                     * to optimize later unlinking (lyd_free()) */
                    lyd_insert_before(root, dummy);
                }
                for (current = dummy; current; current = current->child) {
                    ly_vlog_hide(1);
                    resolve_when(current, &state, 0);
                    ly_vlog_hide(0);
                    if (!state) {
                        /* when evaluates to false */
                        lyd_free(dummy);
                        ly_err_clean(1);
                        return EXIT_SUCCESS;
                    }

                    if (current->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        /* termination node without a child */
                        break;
                    }
                }
                lyd_free(dummy);
            }
        }
        /* the schema instance is not disabled by anything, continue with checking */
    }

    /* checking various mandatory conditions */
    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* mandatory */
        if ((schema->flags & LYS_MAND_TRUE) && !instances->number) {
            LOGVAL(LYE_MISSELEM, LY_VLOG_LYD, last_parent, schema->name,
                   last_parent ? last_parent->schema->name : lys_node_module(schema)->name);
            return EXIT_FAILURE;
        }
        break;
    case LYS_LIST:
        /* min-elements */
        limit = ((struct lys_node_list *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_list *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }

        break;

    case LYS_LEAFLIST:
        /* min-elements */
        limit = ((struct lys_node_leaflist *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_leaflist *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }
        break;
    default:
        /* we cannot get here */
        assert(0);
        break;
    }

    return EXIT_SUCCESS;
}